

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

XMLElement * CGL::Collada::ColladaParser::get_technique_CGL(XMLElement *xml)

{
  bool bVar1;
  XMLElement *this;
  char *pcVar2;
  XMLElement *unaff_R13;
  XMLElement *pXVar3;
  string profile;
  allocator local_71;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&local_70,"extra/technique",(allocator *)&local_50);
  this = get_element(xml,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  do {
    if (this == (XMLElement *)0x0) {
      return (XMLElement *)0x0;
    }
    pcVar2 = tinyxml2::XMLElement::Attribute(this,"profile",(char *)0x0);
    std::__cxx11::string::string((string *)&local_50,pcVar2,&local_71);
    bVar1 = std::operator==(&local_50,"CGL");
    pXVar3 = this;
    if (!bVar1) {
      this = tinyxml2::XMLNode::NextSiblingElement(&this->super_XMLNode,"technique");
      pXVar3 = unaff_R13;
    }
    std::__cxx11::string::~string((string *)&local_50);
    unaff_R13 = pXVar3;
  } while (!bVar1);
  return pXVar3;
}

Assistant:

XMLElement* ColladaParser::get_technique_CGL( XMLElement* xml ) {

  XMLElement* technique = get_element(xml, "extra/technique");
  while (technique) {
    string profile = technique->Attribute("profile");
    if (profile == "CGL") return technique;
    technique = technique->NextSiblingElement("technique");
  }

  return NULL;

}